

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

void xmlDumpElementContent(xmlBufferPtr buf,xmlElementContentPtr content)

{
  xmlElementContentType xVar1;
  int iVar2;
  char *string;
  xmlElementContentPtr cur;
  _xmlElementContent *p_Var3;
  
  if (content != (xmlElementContentPtr)0x0) {
    xmlBufferWriteChar(buf,"(");
    cur = content;
    while (cur != (xmlElementContentPtr)0x0) {
      xVar1 = cur->type;
      if (xVar1 - XML_ELEMENT_CONTENT_SEQ < 2) {
        if (((cur != content) && (cur->parent != (_xmlElementContent *)0x0)) &&
           ((xVar1 != cur->parent->type || (cur->ocur != XML_ELEMENT_CONTENT_ONCE)))) {
          xmlBufferWriteChar(buf,"(");
        }
        p_Var3 = cur->c1;
      }
      else {
        if (xVar1 == XML_ELEMENT_CONTENT_ELEMENT) {
          if (cur->prefix != (xmlChar *)0x0) {
            xmlBufferWriteCHAR(buf,cur->prefix);
            xmlBufferWriteChar(buf,":");
          }
          xmlBufferWriteCHAR(buf,cur->name);
        }
        else if (xVar1 == XML_ELEMENT_CONTENT_PCDATA) {
          xmlBufferWriteChar(buf,"#PCDATA");
        }
        else {
          __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,
                          (void *)0x0,(void *)0x0,0x17,1,XML_ERR_ERROR,(char *)0x0,0,(char *)0x0,
                          (char *)0x0,(char *)0x0,0,0,"%s",
                          "Internal: ELEMENT cur corrupted invalid type\n");
        }
        do {
          p_Var3 = cur;
          if (cur == content) goto LAB_0018f94d;
          p_Var3 = cur->parent;
          if (p_Var3 == (_xmlElementContent *)0x0) {
            iVar2 = 1;
            p_Var3 = cur;
          }
          else {
            if ((cur->type - XML_ELEMENT_CONTENT_SEQ < 2) &&
               ((cur->type != p_Var3->type || (cur->ocur != XML_ELEMENT_CONTENT_ONCE)))) {
              xmlBufferWriteChar(buf,")");
            }
            xmlDumpElementOccur(buf,cur);
            iVar2 = 0;
            if (cur == p_Var3->c1) {
              string = " , ";
              if (p_Var3->type == XML_ELEMENT_CONTENT_SEQ) {
LAB_0018f933:
                xmlBufferWriteChar(buf,string);
              }
              else if (p_Var3->type == XML_ELEMENT_CONTENT_OR) {
                string = " | ";
                goto LAB_0018f933;
              }
              iVar2 = 6;
              p_Var3 = p_Var3->c2;
            }
          }
          cur = p_Var3;
        } while (iVar2 == 0);
        if (iVar2 != 6) {
          return;
        }
      }
LAB_0018f94d:
      cur = p_Var3;
      if (p_Var3 == content) {
        xmlBufferWriteChar(buf,")");
        xmlDumpElementOccur(buf,content);
        return;
      }
    }
  }
  return;
}

Assistant:

static void
xmlDumpElementContent(xmlBufferPtr buf, xmlElementContentPtr content) {
    xmlElementContentPtr cur;

    if (content == NULL) return;

    xmlBufferWriteChar(buf, "(");
    cur = content;

    do {
        if (cur == NULL) return;

        switch (cur->type) {
            case XML_ELEMENT_CONTENT_PCDATA:
                xmlBufferWriteChar(buf, "#PCDATA");
                break;
            case XML_ELEMENT_CONTENT_ELEMENT:
                if (cur->prefix != NULL) {
                    xmlBufferWriteCHAR(buf, cur->prefix);
                    xmlBufferWriteChar(buf, ":");
                }
                xmlBufferWriteCHAR(buf, cur->name);
                break;
            case XML_ELEMENT_CONTENT_SEQ:
            case XML_ELEMENT_CONTENT_OR:
                if ((cur != content) &&
                    (cur->parent != NULL) &&
                    ((cur->type != cur->parent->type) ||
                     (cur->ocur != XML_ELEMENT_CONTENT_ONCE)))
                    xmlBufferWriteChar(buf, "(");
                cur = cur->c1;
                continue;
            default:
                xmlErrValid(NULL, XML_ERR_INTERNAL_ERROR,
                        "Internal: ELEMENT cur corrupted invalid type\n",
                        NULL);
        }

        while (cur != content) {
            xmlElementContentPtr parent = cur->parent;

            if (parent == NULL) return;

            if (((cur->type == XML_ELEMENT_CONTENT_OR) ||
                 (cur->type == XML_ELEMENT_CONTENT_SEQ)) &&
                ((cur->type != parent->type) ||
                 (cur->ocur != XML_ELEMENT_CONTENT_ONCE)))
                xmlBufferWriteChar(buf, ")");
            xmlDumpElementOccur(buf, cur);

            if (cur == parent->c1) {
                if (parent->type == XML_ELEMENT_CONTENT_SEQ)
                    xmlBufferWriteChar(buf, " , ");
                else if (parent->type == XML_ELEMENT_CONTENT_OR)
                    xmlBufferWriteChar(buf, " | ");

                cur = parent->c2;
                break;
            }

            cur = parent;
        }
    } while (cur != content);

    xmlBufferWriteChar(buf, ")");
    xmlDumpElementOccur(buf, content);
}